

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

ostream * tcu::operator<<(ostream *str,CubeFace face)

{
  ostream *poVar1;
  CubeFace face_local;
  ostream *str_local;
  
  switch(face) {
  case CUBEFACE_NEGATIVE_X:
    str_local = std::operator<<(str,"CUBEFACE_NEGATIVE_X");
    break;
  case CUBEFACE_POSITIVE_X:
    str_local = std::operator<<(str,"CUBEFACE_POSITIVE_X");
    break;
  case CUBEFACE_NEGATIVE_Y:
    str_local = std::operator<<(str,"CUBEFACE_NEGATIVE_Y");
    break;
  case CUBEFACE_POSITIVE_Y:
    str_local = std::operator<<(str,"CUBEFACE_POSITIVE_Y");
    break;
  case CUBEFACE_NEGATIVE_Z:
    str_local = std::operator<<(str,"CUBEFACE_NEGATIVE_Z");
    break;
  case CUBEFACE_POSITIVE_Z:
    str_local = std::operator<<(str,"CUBEFACE_POSITIVE_Z");
    break;
  case CUBEFACE_LAST:
    str_local = std::operator<<(str,"CUBEFACE_LAST");
    break;
  default:
    poVar1 = std::operator<<(str,"UNKNOWN(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,face);
    str_local = std::operator<<(poVar1,")");
  }
  return str_local;
}

Assistant:

std::ostream& operator<< (std::ostream& str, CubeFace face)
{
	switch (face)
	{
		case CUBEFACE_NEGATIVE_X:	return str << "CUBEFACE_NEGATIVE_X";
		case CUBEFACE_POSITIVE_X:	return str << "CUBEFACE_POSITIVE_X";
		case CUBEFACE_NEGATIVE_Y:	return str << "CUBEFACE_NEGATIVE_Y";
		case CUBEFACE_POSITIVE_Y:	return str << "CUBEFACE_POSITIVE_Y";
		case CUBEFACE_NEGATIVE_Z:	return str << "CUBEFACE_NEGATIVE_Z";
		case CUBEFACE_POSITIVE_Z:	return str << "CUBEFACE_POSITIVE_Z";
		case CUBEFACE_LAST:			return str << "CUBEFACE_LAST";
		default:					return str << "UNKNOWN(" << (int)face << ")";
	}
}